

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void * arg_hashtable_search(arg_hashtable_t *h,void *k)

{
  arg_hashtable_entry *paVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar2 = (*h->hashfn)(k);
  uVar2 = ~(uVar2 << 9) + uVar2;
  uVar2 = (uVar2 * 0x40000 | uVar2 >> 0xe) ^ uVar2;
  uVar4 = uVar2 * 0x11;
  uVar4 = (uVar2 * 0x4400000 | uVar4 >> 10) ^ uVar4;
  paVar1 = h->table[(ulong)uVar4 % (ulong)h->tablelength];
  while( true ) {
    if (paVar1 == (arg_hashtable_entry *)0x0) {
      return (void *)0x0;
    }
    if ((uVar4 == paVar1->h) && (iVar3 = (*h->eqfn)(k,paVar1->k), iVar3 != 0)) break;
    paVar1 = paVar1->next;
  }
  return paVar1->v;
}

Assistant:

void* arg_hashtable_search(arg_hashtable_t* h, const void* k) {
    struct arg_hashtable_entry* e;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    e = h->table[index];
    while (e != NULL) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k)))
            return e->v;
        e = e->next;
    }
    return NULL;
}